

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserInterface.cpp
# Opt level: O0

void __thiscall
CheckBox::CheckBox(CheckBox *this,string *buttonText,Color *textColor,uint charSize,float x,float y,
                  Color *buttonColor,Color *checkColor,bool startChecked)

{
  Font *font;
  uint in_ECX;
  string *in_RSI;
  undefined8 *in_RDI;
  undefined4 *in_R9;
  float in_XMM0_Da;
  float fVar1;
  float in_XMM1_Da;
  FloatRect FVar2;
  byte in_stack_00000008;
  float BUTTON_HEIGHT;
  undefined4 in_stack_fffffffffffffec8;
  float in_stack_fffffffffffffecc;
  Text *in_stack_fffffffffffffed0;
  RectangleShape *this_00;
  Vector2f *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  Text *local_118;
  locale *locale;
  locale *this_01;
  Vector2<float> local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  Vector2<float> local_90;
  locale local_88 [40];
  float local_60;
  Vector2<float> local_5c;
  Vector2<float> local_54 [3];
  byte local_39;
  undefined4 *local_38;
  float local_24;
  float local_20;
  uint local_1c;
  string *local_10;
  
  local_39 = in_stack_00000008 & 1;
  local_38 = in_R9;
  local_24 = in_XMM1_Da;
  local_20 = in_XMM0_Da;
  local_1c = in_ECX;
  local_10 = in_RSI;
  UIComponent::UIComponent
            ((UIComponent *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  *in_RDI = &PTR__CheckBox_002bc268;
  in_RDI[1] = &PTR__CheckBox_002bc2a0;
  sf::Text::Text(local_118);
  sf::Vector2<float>::Vector2(local_54,0.0,0.0);
  sf::RectangleShape::RectangleShape
            ((RectangleShape *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
             in_stack_fffffffffffffed8);
  sf::Vector2<float>::Vector2(&local_5c,0.0,0.0);
  sf::RectangleShape::RectangleShape
            ((RectangleShape *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
             in_stack_fffffffffffffed8);
  sf::Color::Color((Color *)(in_RDI + 0x9b));
  local_60 = (float)local_1c * 1.5;
  font = Board::getFont();
  sf::Text::setFont((Text *)(in_RDI + 0x17),font);
  locale = (locale *)(in_RDI + 0x17);
  this_01 = local_88;
  std::locale::locale(this_01);
  sf::String::String((String *)this_01,local_10,locale);
  sf::Text::setString(in_stack_fffffffffffffed0,
                      (String *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  sf::String::~String((String *)0x1a9d1b);
  std::locale::~locale(local_88);
  sf::Text::setFillColor
            ((Text *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
             (Color *)in_stack_fffffffffffffed8);
  sf::Text::setCharacterSize((Text *)(in_RDI + 0x17),local_1c);
  sf::Transformable::setPosition((Transformable *)(in_RDI + 0x18),local_60 + 5.0,0.0);
  fVar1 = local_60;
  FVar2 = sf::Text::getLocalBounds
                    ((Text *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  local_a0 = FVar2._0_8_;
  local_98._0_4_ = FVar2.width;
  fVar1 = fVar1 + (float)local_98;
  local_98 = FVar2._8_8_;
  sf::Vector2<float>::Vector2(&local_90,fVar1 + 10.0,local_60);
  sf::RectangleShape::setSize
            ((RectangleShape *)in_stack_fffffffffffffed0,
             (Vector2f *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  sf::Shape::setFillColor
            ((Shape *)in_stack_fffffffffffffed0,
             (Color *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  sf::Transformable::setPosition((Transformable *)(in_RDI + 0x46),0.0,0.0);
  this_00 = (RectangleShape *)(in_RDI + 0x70);
  sf::Vector2<float>::Vector2(&local_a8,local_60 * 0.8,local_60 * 0.8);
  sf::RectangleShape::setSize
            (this_00,(Vector2f *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  if ((local_39 & 1) == 0) {
    sf::Shape::setFillColor
              (&this_00->super_Shape,
               (Color *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  }
  else {
    sf::Shape::setFillColor
              (&this_00->super_Shape,
               (Color *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  }
  sf::Shape::setOutlineColor
            (&this_00->super_Shape,
             (Color *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  sf::Shape::setOutlineThickness(&this_00->super_Shape,in_stack_fffffffffffffecc);
  sf::Transformable::setPosition((Transformable *)(in_RDI + 0x71),local_60 * 0.2,local_60 * 0.1);
  sf::Transformable::setPosition((Transformable *)(in_RDI + 1),local_20,local_24);
  *(undefined4 *)(in_RDI + 0x9b) = *local_38;
  *(byte *)((long)in_RDI + 0x4dc) = local_39 & 1;
  return;
}

Assistant:

CheckBox::CheckBox(const string& buttonText, const Color& textColor, unsigned int charSize, float x, float y, const Color& buttonColor, const Color& checkColor, bool startChecked) {
    const float BUTTON_HEIGHT = charSize * 1.5f;
    text.setFont(Board::getFont());
    text.setString(buttonText);
    text.setFillColor(textColor);
    text.setCharacterSize(charSize);
    text.setPosition(BUTTON_HEIGHT + 5.0f, 0.0f);
    
    button.setSize(Vector2f(BUTTON_HEIGHT + text.getLocalBounds().width + 10.0f, BUTTON_HEIGHT));
    button.setFillColor(buttonColor);
    button.setPosition(0.0f, 0.0f);
    
    check.setSize(Vector2f(BUTTON_HEIGHT * 0.8f, BUTTON_HEIGHT * 0.8f));
    if (!startChecked) {
        check.setFillColor(buttonColor);
    } else {
        check.setFillColor(checkColor);
    }
    check.setOutlineColor(Color::Black);
    check.setOutlineThickness(-2.0f);
    check.setPosition(BUTTON_HEIGHT * 0.2f, BUTTON_HEIGHT * 0.1f);
    
    setPosition(x, y);
    this->checkColor = checkColor;
    _checked = startChecked;
}